

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O0

_Bool plutovg_skip_string(char **begin,char *end,char *data)

{
  char cVar1;
  bool bVar2;
  char *local_30;
  char *it;
  char *data_local;
  char *end_local;
  char **begin_local;
  
  local_30 = *begin;
  it = data;
  while( true ) {
    bVar2 = false;
    if ((local_30 < end) && (bVar2 = false, *it != '\0')) {
      bVar2 = *local_30 == *it;
    }
    if (!bVar2) break;
    it = it + 1;
    local_30 = local_30 + 1;
  }
  cVar1 = *it;
  if (cVar1 == '\0') {
    *begin = local_30;
  }
  return cVar1 == '\0';
}

Assistant:

static inline bool plutovg_skip_string(const char** begin, const char* end, const char* data)
{
    const char* it = *begin;
    while(it < end && *data && *it == *data) {
        ++data;
        ++it;
    }

    if(*data == '\0') {
        *begin = it;
        return true;
    }

    return false;
}